

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::CreateObjectLists
          (cmMakefileTargetGenerator *this,bool useLinkScript,bool useArchiveRules,
          bool useResponseFile,string *buildObjs,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_depends,bool useWatcomQuote,ResponseFlagFor responseMode)

{
  char *__s;
  string *this_00;
  uint __val;
  string_view source;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  object_strings;
  string objects_rsp;
  string responseFlag;
  string variableName;
  string variableNameExternal;
  string local_80;
  string responseFileName;
  
  this_00 = (string *)&object_strings;
  variableName._M_dataplus._M_p = (pointer)&variableName.field_2;
  variableName._M_string_length = 0;
  variableName.field_2._M_local_buf[0] = '\0';
  variableNameExternal._M_dataplus._M_p = (pointer)&variableNameExternal.field_2;
  variableNameExternal._M_string_length = 0;
  variableNameExternal.field_2._M_local_buf[0] = '\0';
  WriteObjectsVariable(this,&variableName,&variableNameExternal,useWatcomQuote);
  if (useResponseFile) {
    object_strings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    object_strings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    object_strings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    WriteObjectsStrings(this,&object_strings,0x1ffb8);
    GetResponseFlag_abi_cxx11_(&responseFlag,this,responseMode);
    __s = "deviceObjects";
    if (responseMode == Link) {
      __s = "objects";
    }
    for (__val = 1;
        (ulong)(__val - 1) <
        (ulong)((long)object_strings.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)object_strings.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5); __val = __val + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&responseFileName,__s,(allocator<char> *)&objects_rsp);
      std::__cxx11::to_string(&objects_rsp,__val);
      std::__cxx11::string::append((string *)&responseFileName);
      std::__cxx11::string::~string((string *)&objects_rsp);
      CreateResponseFile(&objects_rsp,this,&responseFileName,
                         object_strings.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + (__val - 1),makefile_depends);
      std::__cxx11::string::append((char *)buildObjs);
      std::__cxx11::string::append((string *)buildObjs);
      source._M_str = objects_rsp._M_dataplus._M_p;
      source._M_len = objects_rsp._M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_80,
                 &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,source,SHELL);
      std::__cxx11::string::append((string *)buildObjs);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&objects_rsp);
      std::__cxx11::string::~string((string *)&responseFileName);
    }
    std::__cxx11::string::~string((string *)&responseFlag);
  }
  else {
    if (!useLinkScript) {
      responseFlag._M_dataplus._M_p = (pointer)0x2;
      responseFlag._M_string_length = (long)") $(" + 2;
      responseFileName._M_dataplus._M_p = (pointer)variableName._M_string_length;
      responseFileName._M_string_length = (size_type)variableName._M_dataplus._M_p;
      local_80._M_dataplus._M_p._0_1_ = 0x29;
      cmStrCat<char[5],std::__cxx11::string,char>
                (&objects_rsp,(cmAlphaNum *)&responseFlag,(cmAlphaNum *)&responseFileName,
                 (char (*) [5])") $(",&variableNameExternal,(char *)&local_80);
      std::__cxx11::string::operator=((string *)buildObjs,(string *)&objects_rsp);
      std::__cxx11::string::~string((string *)&objects_rsp);
      goto LAB_0042666f;
    }
    if (useArchiveRules) goto LAB_0042666f;
    responseFlag._M_dataplus._M_p = (pointer)0x0;
    responseFlag._M_string_length = 0;
    responseFlag.field_2._M_allocated_capacity = 0;
    WriteObjectsStrings(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&responseFlag,0xffffffffffffffff);
    std::__cxx11::string::_M_assign((string *)buildObjs);
    this_00 = &responseFlag;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_00);
LAB_0042666f:
  std::__cxx11::string::~string((string *)&variableNameExternal);
  std::__cxx11::string::~string((string *)&variableName);
  return;
}

Assistant:

void cmMakefileTargetGenerator::CreateObjectLists(
  bool useLinkScript, bool useArchiveRules, bool useResponseFile,
  std::string& buildObjs, std::vector<std::string>& makefile_depends,
  bool useWatcomQuote, ResponseFlagFor responseMode)
{
  std::string variableName;
  std::string variableNameExternal;
  this->WriteObjectsVariable(variableName, variableNameExternal,
                             useWatcomQuote);
  if (useResponseFile) {
    // MSVC response files cannot exceed 128K.
    std::string::size_type const responseFileLimit = 131000;

    // Construct the individual object list strings.
    std::vector<std::string> object_strings;
    this->WriteObjectsStrings(object_strings, responseFileLimit);

    // Lookup the response file reference flag.
    std::string responseFlag = this->GetResponseFlag(responseMode);

    // Write a response file for each string.
    const char* sep = "";
    for (unsigned int i = 0; i < object_strings.size(); ++i) {
      // Number the response files.
      std::string responseFileName =
        (responseMode == Link) ? "objects" : "deviceObjects";
      responseFileName += std::to_string(i + 1);

      // Create this response file.
      std::string objects_rsp = this->CreateResponseFile(
        responseFileName, object_strings[i], makefile_depends);

      // Separate from previous response file references.
      buildObjs += sep;
      sep = " ";

      // Reference the response file.
      buildObjs += responseFlag;
      buildObjs += this->LocalGenerator->ConvertToOutputFormat(
        objects_rsp, cmOutputConverter::SHELL);
    }
  } else if (useLinkScript) {
    if (!useArchiveRules) {
      std::vector<std::string> objStrings;
      this->WriteObjectsStrings(objStrings);
      buildObjs = objStrings[0];
    }
  } else {
    buildObjs =
      cmStrCat("$(", variableName, ") $(", variableNameExternal, ')');
  }
}